

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

void __thiscall SAT::checkConflict(SAT *this)

{
  char cVar1;
  char cVar2;
  Lit *pLVar3;
  uint i;
  uint i_00;
  
  for (i_00 = 0; i_00 < *(uint *)this->confl >> 8; i_00 = i_00 + 1) {
    pLVar3 = Clause::operator[](this->confl,i_00);
    cVar1 = (this->assigns).data[(uint)(pLVar3->x >> 1)];
    cVar2 = -cVar1;
    if ((pLVar3->x & 1U) == 0) {
      cVar2 = cVar1;
    }
    if (cVar2 != ::l_False.value) {
      printf("Analyze: %dth lit is not false\n",(ulong)i_00);
    }
  }
  return;
}

Assistant:

void SAT::checkConflict() const {
	assert(confl != nullptr);
	for (unsigned int i = 0; i < confl->size(); i++) {
		if (value((*confl)[i]) != l_False) {
			printf("Analyze: %dth lit is not false\n", i);
		}
		assert(value((*confl)[i]) == l_False);
	}

	/*
		printf("Clause %d\n", learnts.size());
		printf("Conflict clause: ");
		printClause(*confl);
	*/
}